

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_InitializeUpload
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,
          char **uploadCorrelationId,char **azureBlobSasUri)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar4 = "invalid parameter iotHubClientHandle=%p";
    iVar3 = 0xba3;
    IVar1 = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                      (iotHubClientHandle->uploadToBlobHandle,destinationFileName,
                       uploadCorrelationId,azureBlobSasUri);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar1 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar4 = "Failed initializing upload in IoT Hub";
    iVar3 = 0xbab;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_InitializeUpload",iVar3,1,pcVar4);
  return IVar1;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_InitializeUpload(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, char** uploadCorrelationId, char** azureBlobSasUri)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        LogError("invalid parameter iotHubClientHandle=%p", iotHubClientHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, uploadCorrelationId, azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}